

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

void __thiscall vm::VM::Tdiv<int>(VM *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  
  ensureStackUsed(this,1);
  iVar1 = this->_sp;
  this->_sp = iVar1 + -1;
  iVar1 = (this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl[(long)iVar1 + -1];
  ensureStackUsed(this,1);
  iVar2 = this->_sp;
  this->_sp = iVar2 + -1;
  if (iVar1 != 0) {
    iVar2 = (this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
            super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl[(long)iVar2 + -1];
    ensureStackRest(this,1);
    iVar3 = this->_sp;
    this->_sp = iVar3 + 1;
    (this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl[iVar3] = iVar2 / iVar1;
    return;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = &PTR__exception_00124cf0;
  __cxa_throw(puVar4,&DivideByZero::typeinfo,std::exception::~exception);
}

Assistant:

void VM::Tdiv() {
    static_assert(std::is_arithmetic_v<T>);
    auto rhs = POP<T>();
    auto lhs = POP<T>();
    if constexpr (std::is_integral_v<T>) {
        if (rhs == 0) {
            throw DivideByZero();
        }
    }
    PUSH(lhs/rhs);
}